

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_int>::tryExpand
          (HoleSet<unsigned_int> *this,uint oldLgSize,uint oldOffset,uint expansionFactor)

{
  bool bVar1;
  
  bVar1 = true;
  if (expansionFactor != 0) {
    if ((this->holes[oldLgSize] == oldOffset + 1) &&
       (bVar1 = tryExpand(this,oldLgSize + 1,oldOffset >> 1,expansionFactor - 1), bVar1)) {
      this->holes[oldLgSize] = 0;
      return true;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool tryExpand(UIntType oldLgSize, uint oldOffset, uint expansionFactor) {
      // Try to expand the value at the given location by combining it with subsequent holes, so
      // as to expand the location to be 2^expansionFactor times the size that it started as.
      // (In other words, the new lgSize is oldLgSize + expansionFactor.)

      if (expansionFactor == 0) {
        // No expansion requested.
        return true;
      }
      if (holes[oldLgSize] != oldOffset + 1) {
        // The space immediately after the location is not a hole.
        return false;
      }

      // We can expand the location by one factor by combining it with a hole.  Try to further
      // expand from there to the number of factors requested.
      if (tryExpand(oldLgSize + 1, oldOffset >> 1, expansionFactor - 1)) {
        // Success.  Consume the hole.
        holes[oldLgSize] = 0;
        return true;
      } else {
        return false;
      }
    }